

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.hpp
# Opt level: O2

bool __thiscall
BTree<StringBTree,_StringKey>::searchByIndex
          (BTree<StringBTree,_StringKey> *this,uint index,StringKey *key)

{
  ushort uVar1;
  uint uVar2;
  uint8_t *puVar3;
  ushort uVar4;
  uint uVar5;
  bool bVar6;
  
  uVar1 = swap_bytes(*(undefined2 *)(this->m_data + 4));
  puVar3 = this->m_data + 6;
  uVar2 = (uint)uVar1;
  while (bVar6 = uVar2 != 0, uVar2 = uVar2 - 1, bVar6) {
    uVar1 = swap_bytes(*(undefined2 *)puVar3);
    uVar5 = uVar1 >> 4 & 0x7ff;
    if (index < uVar5) break;
    uVar4 = swap_bytes(*(undefined2 *)(puVar3 + (uVar5 * 0xc + 0xc >> 3)));
    puVar3 = puVar3 + (uVar4 >> (((byte)(uVar1 >> 4) & 1) << 2) & 0xfff);
    index = index - uVar5;
  }
  uVar1 = swap_bytes(*(undefined2 *)(puVar3 + (index * 0xc + 0xc >> 3)));
  puVar3 = StringBTree::parseData
                     ((StringBTree *)this,key,puVar3 + (uVar1 >> ((byte)(index << 2) & 4) & 0xfff));
  return puVar3 != (uint8_t *)0x0;
}

Assistant:

bool searchByIndex(unsigned int index, Key& key) const
	{
		const auto& self = static_cast<const Derived&>(*this);

		auto p = m_data;
		
		const auto offsetAndCount = readNextWithByteSwap<uint32_t>(p);
		const auto nodeCount = readNextWithByteSwap<uint16_t>(p);
		
		UNUSED(offsetAndCount);
		
		for (auto i = 0u; i < nodeCount; ++i) {
			const auto high = getBitsAt(p, 0) & UINT32_C(0x7FF);
			const auto nextOffset = getBitsAt(p, high + 1);

			if (index < high)
				break;
			index -= high;

			p = advancePointer(p, nextOffset);
		}
		
		const auto offset = getBitsAt(p, index + 1);
		p = advancePointer(p, offset);
		
		return self.parseData(key, p) != nullptr;
	}